

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void __thiscall cppnet::Bitmap::Clear(Bitmap *this)

{
  uint uVar1;
  float fVar2;
  
  uVar1 = this->_vec_bitmap;
  while (uVar1 != 0) {
    fVar2 = log2f((float)((-uVar1 & uVar1) + 1));
    (this->_bitmap).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start[(int)fVar2] = 0;
    uVar1 = this->_vec_bitmap - 1 & this->_vec_bitmap;
    this->_vec_bitmap = uVar1;
  }
  return;
}

Assistant:

void Bitmap::Clear() {
    while (_vec_bitmap != 0) {
        int32_t next_vec_index = (int32_t)std::log2f(float((_vec_bitmap & (-(int32_t)_vec_bitmap)) + 1));
        _bitmap[next_vec_index] = 0;
        _vec_bitmap = _vec_bitmap & (_vec_bitmap - 1);
    }
}